

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse41_128_64.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_table_striped_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  long *plVar1;
  uint uVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  undefined8 uVar6;
  ulong uVar7;
  ushort uVar8;
  uint uVar9;
  longlong lVar10;
  int iVar11;
  int iVar12;
  parasail_result_t *ppVar13;
  __m128i *ptr;
  __m128i *palVar14;
  __m128i *ptr_00;
  int64_t *ptr_01;
  ulong uVar15;
  __m128i *ptr_02;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  char *pcVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  ulong size;
  long lVar27;
  ulong uVar28;
  char *__format;
  long lVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  uint uVar33;
  int iVar34;
  int iVar35;
  ulong uVar36;
  longlong lVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar50 [16];
  longlong lVar51;
  undefined1 extraout_XMM0_01 [16];
  __m128i_64_t B_4;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  __m128i_64_t B;
  long lVar59;
  undefined1 auVar58 [16];
  int64_t iVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  long lVar63;
  __m128i_64_t B_1;
  long lVar66;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  __m128i a;
  __m128i a_00;
  __m128i alVar67;
  __m128i b;
  __m128i b_00;
  __m128i alVar68;
  int local_1ac;
  ulong local_1a0;
  undefined1 local_188 [16];
  undefined1 local_168 [16];
  undefined1 local_138 [16];
  undefined4 local_128;
  undefined4 uStack_124;
  undefined1 local_e8 [16];
  ulong uStack_80;
  ulong uStack_70;
  __m128i_64_t e;
  __m128i_64_t h;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar19 = "profile";
  }
  else {
    pvVar3 = (profile->profile64).score;
    if (pvVar3 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar19 = "profile->profile64.score";
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar19 = "profile->matrix";
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar19 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar19 = "s2";
        }
        else {
          uVar26 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            __format = "%s: %s must be > 0\n";
            pcVar19 = "s2Len";
          }
          else if (open < 0) {
            __format = "%s: %s must be >= 0\n";
            pcVar19 = "open";
          }
          else {
            if (-1 < gap) {
              uVar33 = uVar2 - 1;
              size = (ulong)uVar2 + 1 >> 1;
              uVar7 = (ulong)uVar33 % size;
              uVar17 = (ulong)(uint)open;
              iVar34 = -open;
              iVar12 = ppVar4->min;
              uVar21 = 0x8000000000000000 - (long)iVar12;
              if (iVar12 != iVar34 && SBORROW4(iVar12,iVar34) == iVar12 + open < 0) {
                uVar21 = uVar17 | 0x8000000000000000;
              }
              iVar12 = ppVar4->max;
              ppVar13 = parasail_result_new_table1((uint)((ulong)uVar2 + 1) & 0x7ffffffe,s2Len);
              if (ppVar13 == (parasail_result_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              ppVar13->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar13->flag | 0x2820802;
              ptr = parasail_memalign___m128i(0x10,size);
              palVar14 = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1));
              if ((ptr_01 == (int64_t *)0x0 || ptr_00 == (__m128i *)0x0) ||
                  (palVar14 == (__m128i *)0x0 || ptr == (__m128i *)0x0)) {
                return (parasail_result_t *)0x0;
              }
              iVar11 = s2Len + -1;
              iVar35 = 1 - (int)(uVar33 / size);
              uVar36 = (ulong)(uint)gap;
              uVar15 = uVar21 + 1;
              lVar22 = 0x7ffffffffffffffe - (long)iVar12;
              auVar38._8_4_ = (int)uVar15;
              auVar38._0_8_ = uVar15;
              auVar38._12_4_ = (int)(uVar15 >> 0x20);
              auVar53._8_4_ = (int)lVar22;
              auVar53._0_8_ = lVar22;
              auVar53._12_4_ = (int)((ulong)lVar22 >> 0x20);
              auVar55._0_8_ = (long)iVar35;
              auVar55._8_4_ = iVar35;
              auVar55._12_4_ = iVar35 >> 0x1f;
              lVar27 = (long)iVar34;
              lVar22 = lVar27;
              for (uVar23 = 0; uVar23 != size; uVar23 = uVar23 + 1) {
                lVar29 = lVar22;
                for (lVar30 = 0; lVar30 != 2; lVar30 = lVar30 + 1) {
                  lVar32 = lVar29;
                  if (s1_beg != 0) {
                    lVar32 = 0;
                  }
                  *(long *)((long)&h + lVar30 * 8) = lVar32;
                  *(ulong *)((long)&e + lVar30 * 8) = lVar32 - uVar17;
                  lVar29 = lVar29 - size * (uint)gap;
                }
                ptr[uVar23][0] = h.m[0];
                ptr[uVar23][1] = h.m[1];
                ptr_00[uVar23][0] = e.m[0];
                ptr_00[uVar23][1] = e.m[1];
                lVar22 = lVar22 - (ulong)(uint)gap;
              }
              *ptr_01 = 0;
              for (uVar23 = 1; s2Len + 1 != uVar23; uVar23 = uVar23 + 1) {
                iVar12 = 0;
                if (s2_beg == 0) {
                  iVar12 = iVar34;
                }
                ptr_01[uVar23] = (long)iVar12;
                iVar34 = iVar34 - gap;
              }
              uVar9 = (uint)size;
              lVar22 = size * uVar26 * 4;
              local_1a0 = 0;
              uVar24 = (ulong)(uVar9 - 1) * 0x10;
              local_e8._8_8_ = auVar55._8_8_;
              local_e8._8_8_ = -(ulong)(local_e8._8_8_ == 0);
              local_e8._0_8_ = -(ulong)(auVar55._0_8_ == 1);
              uVar23 = uVar7 * 0x10;
              uVar31 = 0;
              uVar28 = uVar26;
              auVar55 = auVar38;
              local_138 = auVar38;
              local_1ac = iVar11;
              do {
                ptr_02 = palVar14;
                if (uVar31 == uVar26) {
                  alVar67[0] = (ulong)uVar33;
                  if (s2_end != 0) {
                    iVar12 = 0;
                    uVar23 = 1;
                    while( true ) {
                      uVar15 = auVar55._8_8_;
                      if (iVar35 <= iVar12) break;
                      auVar54._8_8_ = 0;
                      auVar54._0_8_ = auVar55._0_8_;
                      auVar55 = auVar54 << 0x40;
                      iVar12 = 1;
                    }
                  }
                  uVar25 = uVar33;
                  if (s1_end != 0) {
                    uVar26 = alVar67[0];
                    for (uVar23 = 0; uVar25 = (uint)uVar26, (uVar9 & 0x3fffffff) * 2 != (int)uVar23;
                        uVar23 = uVar23 + 1) {
                      uVar28 = uVar23 >> 1 & 0x7fffffff;
                      uVar20 = 0;
                      if ((uVar23 & 1) != 0) {
                        uVar20 = uVar9;
                      }
                      uVar20 = uVar20 + (int)uVar28;
                      uVar24 = (ulong)uVar20;
                      if ((int)uVar20 < (int)uVar2) {
                        uVar28 = (*ptr)[uVar23];
                        if ((long)uVar15 < (long)uVar28) {
                          uVar26 = (ulong)uVar20;
                          uVar15 = uVar28;
                          local_1ac = iVar11;
                        }
                        else {
                          if ((int)uVar25 <= (int)uVar20) {
                            uVar20 = uVar25;
                          }
                          uVar24 = (ulong)uVar20;
                          if (local_1ac != iVar11) {
                            uVar24 = uVar26;
                          }
                          if (uVar28 == uVar15) {
                            uVar26 = uVar24;
                          }
                        }
                      }
                    }
                  }
                  iVar12 = (int)uVar15;
                  if (s2_end == 0 && s1_end == 0) {
                    uVar23 = 0;
                    lVar10 = ptr[uVar7][0];
                    lVar51 = ptr[uVar7][1];
                    while (lVar37 = lVar10, (int)uVar23 < iVar35) {
                      lVar10 = 0;
                      lVar51 = lVar37;
                      uVar23 = 1;
                    }
                    iVar12 = (int)lVar51;
                    uVar25 = uVar33;
                    local_1ac = iVar11;
                  }
                  local_128 = (undefined4)uVar21;
                  uStack_124 = (undefined4)(uVar21 >> 0x20);
                  local_168._8_4_ = local_128;
                  local_168._0_8_ = uVar21;
                  local_168._12_4_ = uStack_124;
                  alVar67[1] = uVar28;
                  alVar68[1] = uVar23;
                  alVar68[0] = uVar24;
                  _mm_cmpgt_epi64_rpl(alVar67,alVar68);
                  local_188._0_8_ = auVar53._0_8_;
                  local_188._8_8_ = auVar53._8_8_;
                  auVar56._0_8_ = -(ulong)((long)uVar21 < (long)local_188._0_8_);
                  auVar56._8_8_ = -(ulong)((long)local_168._8_8_ < (long)local_188._8_8_);
                  auVar57._8_4_ = 0xffffffff;
                  auVar57._0_8_ = 0xffffffffffffffff;
                  auVar57._12_4_ = 0xffffffff;
                  auVar53 = auVar57 ^ auVar56 | extraout_XMM0_01;
                  if ((((((((((((((((auVar53 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar53 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar53 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar53 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar53 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar53 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar53 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar53 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar53 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar53 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar53 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar53 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar53 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar53[0xf] < '\0') {
                    *(byte *)&ppVar13->flag = (byte)ppVar13->flag | 0x40;
                    iVar12 = 0;
                    local_1ac = 0;
                    uVar25 = 0;
                  }
                  ppVar13->score = iVar12;
                  ppVar13->end_query = uVar25;
                  ppVar13->end_ref = local_1ac;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr_02);
                  parasail_free(ptr);
                  return ppVar13;
                }
                palVar14 = ptr + (uVar9 - 1);
                auVar61._8_4_ = (int)(*palVar14)[0];
                auVar61._0_8_ = (*palVar14)[0];
                auVar61._12_4_ = *(undefined4 *)((long)*palVar14 + 4);
                iVar12 = ppVar4->mapper[(byte)s2[uVar31]];
                iVar60 = ptr_01[uVar31];
                lVar29 = auVar61._8_8_;
                uVar23 = local_1a0;
                local_188 = auVar38;
                for (uVar24 = 0; uStack_80 = (ulong)(uint)gap, size * 0x10 != uVar24;
                    uVar24 = uVar24 + 0x10) {
                  plVar1 = (long *)((long)pvVar3 + uVar24 + (long)(int)(iVar12 * uVar9) * 0x10);
                  auVar62._0_8_ = iVar60 + *plVar1;
                  auVar62._8_8_ = lVar29 + plVar1[1];
                  auVar54 = *(undefined1 (*) [16])((long)*ptr_00 + uVar24);
                  lVar32 = auVar54._0_8_;
                  auVar39._0_8_ = -(ulong)(lVar32 < auVar62._0_8_);
                  lVar59 = auVar54._8_8_;
                  auVar39._8_8_ = -(ulong)(lVar59 < auVar62._8_8_);
                  auVar57 = blendvpd(auVar54,auVar62,auVar39);
                  lVar63 = local_188._0_8_;
                  auVar40._0_8_ = -(ulong)(lVar63 < auVar57._0_8_);
                  lVar66 = local_188._8_8_;
                  auVar40._8_8_ = -(ulong)(lVar66 < auVar57._8_8_);
                  auVar57 = blendvpd(local_188,auVar57,auVar40);
                  *(undefined1 (*) [16])((long)*ptr_02 + uVar24) = auVar57;
                  lVar29 = auVar57._0_8_;
                  auVar41._0_8_ = -(ulong)(lVar29 < local_138._0_8_);
                  lVar30 = auVar57._8_8_;
                  auVar41._8_8_ = -(ulong)(lVar30 < local_138._8_8_);
                  local_138 = blendvpd(auVar57,local_138,auVar41);
                  auVar42._0_8_ = -(ulong)(auVar53._0_8_ < lVar29);
                  auVar42._8_8_ = -(ulong)(auVar53._8_8_ < lVar30);
                  auVar53 = blendvpd(auVar57,auVar53,auVar42);
                  auVar43._0_8_ = -(ulong)(auVar53._0_8_ < lVar32);
                  auVar43._8_8_ = -(ulong)(auVar53._8_8_ < lVar59);
                  auVar53 = blendvpd(auVar54,auVar53,auVar43);
                  auVar44._0_8_ = -(ulong)(auVar53._0_8_ < lVar63);
                  auVar44._8_8_ = -(ulong)(auVar53._8_8_ < lVar66);
                  auVar53 = blendvpd(local_188,auVar53,auVar44);
                  piVar5 = ((ppVar13->field_4).rowcols)->score_row;
                  *(int *)((long)piVar5 + uVar23) = auVar57._0_4_;
                  uVar28 = (long)piVar5 + uVar23;
                  *(int *)(lVar22 + uVar28) = auVar57._8_4_;
                  uStack_70 = (ulong)(uint)open;
                  auVar52._0_8_ = lVar29 - uVar17;
                  auVar52._8_8_ = lVar30 - uStack_70;
                  auVar58._0_8_ = lVar32 - uVar36;
                  auVar58._8_8_ = lVar59 - uStack_80;
                  auVar45._0_8_ = -(ulong)(auVar52._0_8_ < auVar58._0_8_);
                  auVar45._8_8_ = -(ulong)(auVar52._8_8_ < auVar58._8_8_);
                  auVar54 = blendvpd(auVar52,auVar58,auVar45);
                  *(undefined1 (*) [16])((long)*ptr_00 + uVar24) = auVar54;
                  auVar64._0_8_ = lVar63 - uVar36;
                  auVar64._8_8_ = lVar66 - uStack_80;
                  auVar46._0_8_ = -(ulong)(auVar52._0_8_ < auVar64._0_8_);
                  auVar46._8_8_ = -(ulong)(auVar52._8_8_ < auVar64._8_8_);
                  local_188 = blendvpd(auVar52,auVar64,auVar46);
                  plVar1 = (long *)((long)*ptr + uVar24);
                  iVar60 = *plVar1;
                  lVar29 = plVar1[1];
                  uVar23 = uVar23 + uVar26 * 4;
                }
                for (iVar12 = 0; local_168 = auVar53, iVar12 != 2; iVar12 = iVar12 + 1) {
                  lVar29 = lVar27;
                  if (s2_beg == 0) {
                    lVar29 = ptr_01[uVar31 + 1] - uVar17;
                  }
                  auVar65._0_8_ = local_188._0_8_;
                  auVar65._8_4_ = local_188._0_4_;
                  auVar65._12_4_ = local_188._4_4_;
                  local_188._8_8_ = auVar65._8_8_;
                  local_188._0_8_ = lVar29;
                  uVar16 = local_1a0;
                  uVar18 = 0;
                  while( true ) {
                    uVar23 = uVar18 + 0x10;
                    if (size * 0x10 + 0x10 == uVar23) break;
                    auVar54 = *(undefined1 (*) [16])((long)*ptr_02 + uVar18);
                    lVar29 = local_188._0_8_;
                    auVar47._0_8_ = -(ulong)(lVar29 < auVar54._0_8_);
                    auVar47._8_8_ = -(ulong)(local_188._8_8_ < auVar54._8_8_);
                    auVar54 = blendvpd(local_188,auVar54,auVar47);
                    *(undefined1 (*) [16])((long)*ptr_02 + uVar18) = auVar54;
                    auVar48._0_8_ = -(ulong)(auVar53._0_8_ < auVar54._0_8_);
                    auVar48._8_8_ = -(ulong)(auVar53._8_8_ < auVar54._8_8_);
                    auVar53 = blendvpd(auVar54,auVar53,auVar48);
                    piVar5 = ((ppVar13->field_4).rowcols)->score_row;
                    *(int *)((long)piVar5 + uVar16) = auVar54._0_4_;
                    uVar6 = extractps(auVar54,2);
                    *(undefined8 *)(lVar22 + (long)piVar5 + uVar16) = uVar6;
                    auVar49._0_8_ = -(ulong)(auVar54._0_8_ < local_138._0_8_);
                    auVar49._8_8_ = -(ulong)(auVar54._8_8_ < local_138._8_8_);
                    local_138 = blendvpd(auVar54,local_138,auVar49);
                    local_188._8_8_ = local_188._8_8_ - uStack_80;
                    local_188._0_8_ = lVar29 - uVar36;
                    a[1] = uVar28;
                    a[0] = (longlong)ppVar13;
                    b[1] = (longlong)piVar5;
                    b[0] = (long)piVar5 + uVar16;
                    _mm_cmpgt_epi64_rpl(a,b);
                    uVar8 = (ushort)(SUB161(extraout_XMM0 >> 7,0) & 1) |
                            (ushort)(SUB161(extraout_XMM0 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(extraout_XMM0 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(extraout_XMM0 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(extraout_XMM0 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(extraout_XMM0 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(extraout_XMM0 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(extraout_XMM0 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(extraout_XMM0 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(extraout_XMM0 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(extraout_XMM0 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(extraout_XMM0 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(extraout_XMM0 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(extraout_XMM0 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(extraout_XMM0 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(extraout_XMM0[0xf] >> 7) << 0xf;
                    uVar24 = (ulong)uVar8;
                    uVar16 = uVar16 + uVar26 * 4;
                    uVar18 = uVar23;
                    local_168 = auVar53;
                    if (uVar8 == 0) goto LAB_00666e97;
                  }
                  uVar23 = uVar18;
                }
LAB_00666e97:
                palVar14 = ptr_02 + uVar7;
                lVar29 = (*palVar14)[0];
                lVar30 = (*palVar14)[1];
                alVar67 = *palVar14;
                a_00[1] = uVar28;
                a_00[0] = (longlong)ppVar13;
                b_00[1] = uVar23;
                b_00[0] = uVar24;
                alVar68 = _mm_cmpgt_epi64_rpl(a_00,b_00);
                uVar24 = alVar68[1];
                auVar53 = extraout_XMM0_00 & local_e8;
                auVar50._0_8_ = -(ulong)(auVar55._0_8_ < lVar29);
                auVar50._8_8_ = -(ulong)(auVar55._8_8_ < lVar30);
                auVar55 = blendvpd(auVar55,(undefined1  [16])alVar67,auVar50);
                if ((((((((((((((((auVar53 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar53 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar53 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar53 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar53 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar53 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar53 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar53 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar53 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar53 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar53 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar53 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar53[0xf] < '\0') {
                  local_1ac = (int)uVar31;
                }
                uVar31 = uVar31 + 1;
                local_1a0 = local_1a0 + 4;
                palVar14 = ptr;
                ptr = ptr_02;
                auVar53 = local_168;
              } while( true );
            }
            __format = "%s: %s must be >= 0\n";
            pcVar19 = "gap";
          }
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_table_striped_profile_sse41_128_64",pcVar19);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi64(_mm_set1_epi64x_rpl(position),
            _mm_set_epi64x_rpl(0,1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi64_rpl(vH, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi64(vH, vGapO);
            vE = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm_slli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi64(vH, vGapO);
                vF = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi64_rpl(vF, vH))) goto end;
                /*vF = _mm_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi64_rpl(vH, vMaxH));
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}